

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BPlusTree *this_01;
  Block *this_02;
  Block *this_03;
  Block *this_04;
  Block *this_05;
  Record local_9e8;
  Record local_9c0;
  Record local_998;
  Record local_970;
  Record local_948;
  Record local_920;
  Record local_8f8;
  Record local_8d0;
  Record local_8a8;
  Record local_880;
  Record local_858;
  Record local_830;
  Record local_808;
  Record local_7e0;
  Record local_7b8;
  Record local_790;
  Record local_768;
  Record local_740;
  size_type *local_718;
  Record r19;
  long local_6e8;
  undefined1 local_6e0 [16];
  undefined1 *local_6d0;
  long local_6c8;
  undefined1 local_6c0 [16];
  undefined1 *local_6b0;
  long local_6a8;
  undefined1 local_6a0 [16];
  undefined1 *local_690;
  long local_688;
  undefined1 local_680 [16];
  undefined1 *local_670;
  long local_668;
  undefined1 local_660 [16];
  undefined1 *local_650;
  long local_648;
  undefined1 local_640 [16];
  undefined1 *local_630;
  long local_628;
  undefined1 local_620 [16];
  undefined1 *local_610;
  long local_608;
  undefined1 local_600 [16];
  undefined1 *local_5f0;
  long local_5e8;
  undefined1 local_5e0 [16];
  undefined1 *local_5d0;
  long local_5c8;
  undefined1 local_5c0 [16];
  undefined1 *local_5b0;
  long local_5a8;
  undefined1 local_5a0 [16];
  undefined1 *local_590;
  long local_588;
  undefined1 local_580 [16];
  undefined1 *local_570;
  long local_568;
  undefined1 local_560 [16];
  undefined1 *local_550;
  long local_548;
  undefined1 local_540 [16];
  undefined1 *local_530;
  long local_528;
  undefined1 local_520 [16];
  undefined1 *local_510;
  long local_508;
  undefined1 local_500 [16];
  undefined1 *local_4f0;
  long local_4e8;
  undefined1 local_4e0 [16];
  undefined1 *local_4d0;
  long local_4c8;
  undefined1 local_4c0 [16];
  undefined1 *local_4b0;
  long local_4a8;
  undefined1 local_4a0 [16];
  size_type *local_490;
  Record r1;
  Record r2;
  Record r3;
  Record r4;
  Record r5;
  Record r6;
  Record r7;
  Record r8;
  Record r9;
  Record r10;
  Record r11;
  Record r12;
  Record r13;
  Record r14;
  Record r15;
  Record r16;
  Record r17;
  Record r18;
  shared_ptr<Block> local_1b0;
  shared_ptr<Block> local_1a0;
  shared_ptr<Block> local_190;
  shared_ptr<Block> local_180;
  shared_ptr<Block> local_170;
  shared_ptr<Block> local_160;
  shared_ptr<Block> local_150;
  shared_ptr<Block> local_140;
  shared_ptr<Block> local_130;
  shared_ptr<Block> local_120;
  shared_ptr<Block> local_110;
  shared_ptr<Block> local_100;
  shared_ptr<Block> local_f0;
  shared_ptr<Block> local_e0;
  shared_ptr<Block> local_d0;
  shared_ptr<Block> local_c0;
  Block *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  Block *local_a0;
  Block *local_98;
  Block *local_90;
  Block *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  BPlusTree *local_38;
  
  *(undefined8 *)ctx = 0;
  *(undefined8 *)(ctx + 8) = 0;
  *(undefined4 *)(ctx + 0x10) = 3;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ctx + 8);
  *(undefined8 *)ctx = 0;
  *(undefined8 *)(ctx + 8) = 0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  *(undefined4 *)(ctx + 0x14) = 0;
  r19._32_8_ = local_6e0;
  local_38 = (BPlusTree *)ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&r19.averageRating,"r1","");
  local_490 = &r1.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&local_490,r19._32_8_,local_6e8 + r19._32_8_);
  r1.tconst.field_2._8_8_ = 0x13f800000;
  if ((undefined1 *)r19._32_8_ != local_6e0) {
    operator_delete((void *)r19._32_8_);
  }
  local_6d0 = local_6c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"r2","");
  r1._32_8_ = &r2.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r1.averageRating,local_6d0,local_6d0 + local_6c8);
  r2.tconst.field_2._8_8_ = 0x240000000;
  if (local_6d0 != local_6c0) {
    operator_delete(local_6d0);
  }
  local_6b0 = local_6a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"r3","");
  r2._32_8_ = &r3.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r2.averageRating,local_6b0,local_6b0 + local_6a8);
  r3.tconst.field_2._8_8_ = 0x340400000;
  if (local_6b0 != local_6a0) {
    operator_delete(local_6b0);
  }
  local_690 = local_680;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"r4","");
  r3._32_8_ = &r4.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r3.averageRating,local_690,local_690 + local_688);
  r4.tconst.field_2._8_8_ = 0x440800000;
  if (local_690 != local_680) {
    operator_delete(local_690);
  }
  local_670 = local_660;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"r5","");
  r4._32_8_ = &r5.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r4.averageRating,local_670,local_670 + local_668);
  r5.tconst.field_2._8_8_ = 0x540a00000;
  if (local_670 != local_660) {
    operator_delete(local_670);
  }
  local_650 = local_640;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"r6","");
  r5._32_8_ = &r6.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r5.averageRating,local_650,local_650 + local_648);
  r6.tconst.field_2._8_8_ = 0x640c00000;
  if (local_650 != local_640) {
    operator_delete(local_650);
  }
  local_630 = local_620;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"r7","");
  r6._32_8_ = &r7.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r6.averageRating,local_630,local_630 + local_628);
  r7.tconst.field_2._8_8_ = 0x740e00000;
  if (local_630 != local_620) {
    operator_delete(local_630);
  }
  local_610 = local_600;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"r8","");
  r7._32_8_ = &r8.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r7.averageRating,local_610,local_610 + local_608);
  r8.tconst.field_2._8_8_ = 0x841000000;
  if (local_610 != local_600) {
    operator_delete(local_610);
  }
  local_5f0 = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"r9","");
  r8._32_8_ = &r9.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r8.averageRating,local_5f0,local_5f0 + local_5e8);
  r9.tconst.field_2._8_8_ = 0x941100000;
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0);
  }
  local_5d0 = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"r10","");
  r9._32_8_ = &r10.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r9.averageRating,local_5d0,local_5d0 + local_5c8);
  r10.tconst.field_2._8_8_ = 0xa41200000;
  if (local_5d0 != local_5c0) {
    operator_delete(local_5d0);
  }
  local_5b0 = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"r11","");
  r10._32_8_ = &r11.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r10.averageRating,local_5b0,local_5b0 + local_5a8);
  r11.tconst.field_2._8_8_ = 0xb41300000;
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  local_590 = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"r12","");
  r11._32_8_ = &r12.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r11.averageRating,local_590,local_590 + local_588);
  r12.tconst.field_2._8_8_ = 0xc41400000;
  if (local_590 != local_580) {
    operator_delete(local_590);
  }
  local_570 = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"r13","");
  r12._32_8_ = &r13.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r12.averageRating,local_570,local_570 + local_568);
  r13.tconst.field_2._8_8_ = 0xd41500000;
  if (local_570 != local_560) {
    operator_delete(local_570);
  }
  local_550 = local_540;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"r14","");
  r13._32_8_ = &r14.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r13.averageRating,local_550,local_550 + local_548);
  r14.tconst.field_2._8_8_ = 0xe41600000;
  if (local_550 != local_540) {
    operator_delete(local_550);
  }
  local_530 = local_520;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"r15","");
  r14._32_8_ = &r15.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r14.averageRating,local_530,local_530 + local_528);
  r15.tconst.field_2._8_8_ = 0xf41700000;
  if (local_530 != local_520) {
    operator_delete(local_530);
  }
  local_510 = local_500;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"r16","");
  r15._32_8_ = &r16.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r15.averageRating,local_510,local_510 + local_508);
  r16.tconst.field_2._8_8_ = 0x1041800000;
  if (local_510 != local_500) {
    operator_delete(local_510);
  }
  local_4f0 = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"r17","");
  r16._32_8_ = &r17.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r16.averageRating,local_4f0,local_4f0 + local_4e8);
  r17.tconst.field_2._8_8_ = 0x1141880000;
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0);
  }
  local_4d0 = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"r18","");
  r17._32_8_ = &r18.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&r17.averageRating,local_4d0,local_4d0 + local_4c8);
  r18.tconst.field_2._8_8_ = 0x1241900000;
  if (local_4d0 != local_4c0) {
    operator_delete(local_4d0);
  }
  local_4b0 = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"r19","");
  local_718 = &r19.tconst._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&local_718,local_4b0,local_4b0 + local_4a8);
  r19.tconst.field_2._8_8_ = 0x1341980000;
  if (local_4b0 != local_4a0) {
    operator_delete(local_4b0);
  }
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_60->_M_use_count = 1;
  local_60->_M_weak_count = 1;
  local_60->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_60[1]._vptr__Sp_counted_base = 2;
  local_60[1]._M_use_count = 0;
  local_60[1]._M_weak_count = 0;
  local_60[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_60[2]._M_use_count = 0;
  local_60[2]._M_weak_count = 0;
  local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_58->_M_use_count = 1;
  local_58->_M_weak_count = 1;
  local_58->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_58[1]._vptr__Sp_counted_base = 2;
  local_58[1]._M_use_count = 0;
  local_58[1]._M_weak_count = 0;
  local_58[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58[2]._M_use_count = 0;
  local_58[2]._M_weak_count = 0;
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_50->_M_use_count = 1;
  local_50->_M_weak_count = 1;
  local_50->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_50[1]._vptr__Sp_counted_base = 2;
  local_50[1]._M_use_count = 0;
  local_50[1]._M_weak_count = 0;
  local_50[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_50[2]._M_use_count = 0;
  local_50[2]._M_weak_count = 0;
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_48->_M_use_count = 1;
  local_48->_M_weak_count = 1;
  local_48->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_48[1]._vptr__Sp_counted_base = 2;
  local_48[1]._M_use_count = 0;
  local_48[1]._M_weak_count = 0;
  local_48[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_48[2]._M_use_count = 0;
  local_48[2]._M_weak_count = 0;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_40->_M_use_count = 1;
  local_40->_M_weak_count = 1;
  local_40->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_40[1]._vptr__Sp_counted_base = 2;
  local_40[1]._M_use_count = 0;
  local_40[1]._M_weak_count = 0;
  local_40[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_40[2]._M_use_count = 0;
  local_40[2]._M_weak_count = 0;
  local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_80->_M_use_count = 1;
  local_80->_M_weak_count = 1;
  local_80->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_80[1]._vptr__Sp_counted_base = 2;
  local_80[1]._M_use_count = 0;
  local_80[1]._M_weak_count = 0;
  local_80[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_80[2]._M_use_count = 0;
  local_80[2]._M_weak_count = 0;
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_78->_M_use_count = 1;
  local_78->_M_weak_count = 1;
  local_78->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_78[1]._vptr__Sp_counted_base = 2;
  local_78[1]._M_use_count = 0;
  local_78[1]._M_weak_count = 0;
  local_78[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_78[2]._M_use_count = 0;
  local_78[2]._M_weak_count = 0;
  local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_70->_M_use_count = 1;
  local_70->_M_weak_count = 1;
  local_70->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_70[1]._vptr__Sp_counted_base = 2;
  local_70[1]._M_use_count = 0;
  local_70[1]._M_weak_count = 0;
  local_70[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_70[2]._M_use_count = 0;
  local_70[2]._M_weak_count = 0;
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_68->_M_use_count = 1;
  local_68->_M_weak_count = 1;
  local_68->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_68[1]._vptr__Sp_counted_base = 2;
  local_68[1]._M_use_count = 0;
  local_68[1]._M_weak_count = 0;
  local_68[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_68[2]._M_use_count = 0;
  local_68[2]._M_weak_count = 0;
  local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_a8->_M_use_count = 1;
  local_a8->_M_weak_count = 1;
  local_a8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159f40;
  *(undefined2 *)&local_a8[1]._vptr__Sp_counted_base = 2;
  local_a8[1]._M_use_count = 0;
  local_a8[1]._M_weak_count = 0;
  local_a8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_a8[2]._M_use_count = 0;
  local_a8[2]._M_weak_count = 0;
  paVar1 = &local_9e8.tconst.field_2;
  local_9e8.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9e8,local_490,r1.tconst._M_dataplus._M_p + (long)local_490);
  local_a0 = (Block *)(local_60 + 1);
  local_9e8.averageRating = (float)r1.tconst.field_2._8_4_;
  local_9e8.numVotes = r1.tconst.field_2._12_4_;
  Block::addRecord(local_a0,&local_9e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_9e8.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_9c0.tconst.field_2;
  local_9c0.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9c0,r1._32_8_,r2.tconst._M_dataplus._M_p + r1._32_8_);
  local_9c0.averageRating = (float)r2.tconst.field_2._8_4_;
  local_9c0.numVotes = r2.tconst.field_2._12_4_;
  Block::addRecord(local_a0,&local_9c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_9c0.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_998.tconst.field_2;
  local_998.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_998,r2._32_8_,r3.tconst._M_dataplus._M_p + r2._32_8_);
  local_98 = (Block *)(local_58 + 1);
  local_998.averageRating = (float)r3.tconst.field_2._8_4_;
  local_998.numVotes = r3.tconst.field_2._12_4_;
  Block::addRecord(local_98,&local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_998.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_970.tconst.field_2;
  local_970.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_970,r3._32_8_,r4.tconst._M_dataplus._M_p + r3._32_8_);
  local_970.averageRating = (float)r4.tconst.field_2._8_4_;
  local_970.numVotes = r4.tconst.field_2._12_4_;
  Block::addRecord(local_98,&local_970);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_970.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_948.tconst.field_2;
  local_948.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_948,r4._32_8_,r5.tconst._M_dataplus._M_p + r4._32_8_);
  local_90 = (Block *)(local_50 + 1);
  local_948.averageRating = (float)r5.tconst.field_2._8_4_;
  local_948.numVotes = r5.tconst.field_2._12_4_;
  Block::addRecord(local_90,&local_948);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_948.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_920.tconst.field_2;
  local_920.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_920,r5._32_8_,r6.tconst._M_dataplus._M_p + r5._32_8_);
  local_920.averageRating = (float)r6.tconst.field_2._8_4_;
  local_920.numVotes = r6.tconst.field_2._12_4_;
  Block::addRecord(local_90,&local_920);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_920.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_8f8.tconst.field_2;
  local_8f8.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8f8,r6._32_8_,r7.tconst._M_dataplus._M_p + r6._32_8_);
  local_88 = (Block *)(local_48 + 1);
  local_8f8.averageRating = (float)r7.tconst.field_2._8_4_;
  local_8f8.numVotes = r7.tconst.field_2._12_4_;
  Block::addRecord(local_88,&local_8f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_8f8.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_8d0.tconst.field_2;
  local_8d0.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8d0,r7._32_8_,r8.tconst._M_dataplus._M_p + r7._32_8_);
  local_8d0.averageRating = (float)r8.tconst.field_2._8_4_;
  local_8d0.numVotes = r8.tconst.field_2._12_4_;
  Block::addRecord(local_88,&local_8d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_8a8.tconst.field_2;
  local_8a8.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8a8,r8._32_8_,r9.tconst._M_dataplus._M_p + r8._32_8_);
  this_03 = (Block *)(local_40 + 1);
  local_8a8.averageRating = (float)r9.tconst.field_2._8_4_;
  local_8a8.numVotes = r9.tconst.field_2._12_4_;
  Block::addRecord(this_03,&local_8a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_8a8.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_880.tconst.field_2;
  local_880.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_880,r9._32_8_,r10.tconst._M_dataplus._M_p + r9._32_8_);
  local_880.averageRating = (float)r10.tconst.field_2._8_4_;
  local_880.numVotes = r10.tconst.field_2._12_4_;
  Block::addRecord(this_03,&local_880);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_880.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_858.tconst.field_2;
  local_858.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_858,r10._32_8_,r11.tconst._M_dataplus._M_p + r10._32_8_);
  this_04 = (Block *)(local_80 + 1);
  local_858.averageRating = (float)r11.tconst.field_2._8_4_;
  local_858.numVotes = r11.tconst.field_2._12_4_;
  Block::addRecord(this_04,&local_858);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_858.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_830.tconst.field_2;
  local_830.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_830,r11._32_8_,r12.tconst._M_dataplus._M_p + r11._32_8_);
  local_830.averageRating = (float)r12.tconst.field_2._8_4_;
  local_830.numVotes = r12.tconst.field_2._12_4_;
  Block::addRecord(this_04,&local_830);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_830.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_808.tconst.field_2;
  local_808.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_808,r12._32_8_,r13.tconst._M_dataplus._M_p + r12._32_8_);
  this_05 = (Block *)(local_78 + 1);
  local_808.averageRating = (float)r13.tconst.field_2._8_4_;
  local_808.numVotes = r13.tconst.field_2._12_4_;
  Block::addRecord(this_05,&local_808);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_808.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_7e0.tconst.field_2;
  local_7e0.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7e0,r13._32_8_,r14.tconst._M_dataplus._M_p + r13._32_8_);
  local_7e0.averageRating = (float)r14.tconst.field_2._8_4_;
  local_7e0.numVotes = r14.tconst.field_2._12_4_;
  Block::addRecord(this_05,&local_7e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_7e0.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_7b8.tconst.field_2;
  local_7b8.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7b8,r14._32_8_,r15.tconst._M_dataplus._M_p + r14._32_8_);
  this_02 = (Block *)(local_70 + 1);
  local_7b8.averageRating = (float)r15.tconst.field_2._8_4_;
  local_7b8.numVotes = r15.tconst.field_2._12_4_;
  Block::addRecord(this_02,&local_7b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_7b8.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_790.tconst.field_2;
  local_790.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_790,r15._32_8_,r16.tconst._M_dataplus._M_p + r15._32_8_);
  local_790.averageRating = (float)r16.tconst.field_2._8_4_;
  local_790.numVotes = r16.tconst.field_2._12_4_;
  Block::addRecord(this_02,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_790.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_768.tconst.field_2;
  local_768.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_768,r16._32_8_,r17.tconst._M_dataplus._M_p + r16._32_8_);
  local_b0 = (Block *)(local_68 + 1);
  local_768.averageRating = (float)r17.tconst.field_2._8_4_;
  local_768.numVotes = r17.tconst.field_2._12_4_;
  Block::addRecord(local_b0,&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_768.tconst._M_dataplus._M_p);
  }
  paVar1 = &local_740.tconst.field_2;
  local_740.tconst._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_740,r17._32_8_,r18.tconst._M_dataplus._M_p + r17._32_8_);
  local_740.averageRating = (float)r18.tconst.field_2._8_4_;
  local_740.numVotes = r18.tconst.field_2._12_4_;
  Block::addRecord(local_b0,&local_740);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740.tconst._M_dataplus._M_p != paVar1) {
    operator_delete(local_740.tconst._M_dataplus._M_p);
  }
  p_Var2 = local_60;
  r18._32_8_ = local_a0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_60->_M_use_count = local_60->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_60->_M_use_count = local_60->_M_use_count + 1;
  }
  BPlusTree::InsertKey(local_38,1.0,(shared_ptr<Block> *)&r18.averageRating);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  local_1b0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a0;
  local_1b0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_60;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_60->_M_use_count = local_60->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_60->_M_use_count = local_60->_M_use_count + 1;
  }
  BPlusTree::InsertKey(local_38,2.0,&local_1b0);
  if (local_1b0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_1a0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_1a0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_58;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_58->_M_use_count = local_58->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_58->_M_use_count = local_58->_M_use_count + 1;
  }
  BPlusTree::InsertKey(local_38,3.0,&local_1a0);
  if (local_1a0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_190.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_190.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_58;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_58->_M_use_count = local_58->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_58->_M_use_count = local_58->_M_use_count + 1;
  }
  BPlusTree::InsertKey(local_38,4.0,&local_190);
  if (local_190.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_180.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_90;
  local_180.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_50;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_50->_M_use_count = local_50->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_50->_M_use_count = local_50->_M_use_count + 1;
  }
  BPlusTree::InsertKey(local_38,5.0,&local_180);
  if (local_180.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_170.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_90;
  local_170.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_50;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_50->_M_use_count = local_50->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_50->_M_use_count = local_50->_M_use_count + 1;
  }
  BPlusTree::InsertKey(local_38,6.0,&local_170);
  if (local_170.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_160.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  local_160.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_48;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_48->_M_use_count = local_48->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_48->_M_use_count = local_48->_M_use_count + 1;
  }
  BPlusTree::InsertKey(local_38,7.0,&local_160);
  if (local_160.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_150.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  local_150.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_48;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_48->_M_use_count = local_48->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_48->_M_use_count = local_48->_M_use_count + 1;
  }
  BPlusTree::InsertKey(local_38,8.0,&local_150);
  if (local_150.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_140.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_40;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_40->_M_use_count = local_40->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_40->_M_use_count = local_40->_M_use_count + 1;
  }
  local_140.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_03;
  BPlusTree::InsertKey(local_38,9.0,&local_140);
  if (local_140.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  this_01 = local_38;
  local_130.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_40;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_40->_M_use_count = local_40->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_40->_M_use_count = local_40->_M_use_count + 1;
  }
  local_130.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_03;
  BPlusTree::InsertKey(local_38,10.0,&local_130);
  if (local_130.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_120.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_80;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_80->_M_use_count = local_80->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_80->_M_use_count = local_80->_M_use_count + 1;
  }
  local_120.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_04;
  BPlusTree::InsertKey(this_01,11.0,&local_120);
  if (local_120.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  p_Var2 = local_80;
  local_110.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_80;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_80->_M_use_count = local_80->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_80->_M_use_count = local_80->_M_use_count + 1;
  }
  local_110.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_04;
  BPlusTree::InsertKey(this_01,12.0,&local_110);
  if (local_110.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_100.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_78;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_78->_M_use_count = local_78->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_78->_M_use_count = local_78->_M_use_count + 1;
  }
  local_100.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_05;
  BPlusTree::InsertKey(this_01,13.0,&local_100);
  if (local_100.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  this = local_78;
  local_f0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_78;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_78->_M_use_count = local_78->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_78->_M_use_count = local_78->_M_use_count + 1;
  }
  local_f0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_05;
  BPlusTree::InsertKey(this_01,14.0,&local_f0);
  if (local_f0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_e0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_70;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_70->_M_use_count = local_70->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_70->_M_use_count = local_70->_M_use_count + 1;
  }
  local_e0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_02;
  BPlusTree::InsertKey(this_01,15.0,&local_e0);
  if (local_e0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  this_00 = local_70;
  local_d0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_70;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_70->_M_use_count = local_70->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_70->_M_use_count = local_70->_M_use_count + 1;
  }
  local_d0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_02;
  BPlusTree::InsertKey(this_01,16.0,&local_d0);
  if (local_d0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_c0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b0;
  local_c0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_68;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_68->_M_use_count = local_68->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_68->_M_use_count = local_68->_M_use_count + 1;
  }
  BPlusTree::InsertKey(this_01,17.0,&local_c0);
  if (local_c0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  if (local_718 != &r19.tconst._M_string_length) {
    operator_delete(local_718);
  }
  if ((size_type *)r17._32_8_ != &r18.tconst._M_string_length) {
    operator_delete((void *)r17._32_8_);
  }
  if ((size_type *)r16._32_8_ != &r17.tconst._M_string_length) {
    operator_delete((void *)r16._32_8_);
  }
  if ((size_type *)r15._32_8_ != &r16.tconst._M_string_length) {
    operator_delete((void *)r15._32_8_);
  }
  if ((size_type *)r14._32_8_ != &r15.tconst._M_string_length) {
    operator_delete((void *)r14._32_8_);
  }
  if ((size_type *)r13._32_8_ != &r14.tconst._M_string_length) {
    operator_delete((void *)r13._32_8_);
  }
  if ((size_type *)r12._32_8_ != &r13.tconst._M_string_length) {
    operator_delete((void *)r12._32_8_);
  }
  if ((size_type *)r11._32_8_ != &r12.tconst._M_string_length) {
    operator_delete((void *)r11._32_8_);
  }
  if ((size_type *)r10._32_8_ != &r11.tconst._M_string_length) {
    operator_delete((void *)r10._32_8_);
  }
  if ((size_type *)r9._32_8_ != &r10.tconst._M_string_length) {
    operator_delete((void *)r9._32_8_);
  }
  if ((size_type *)r8._32_8_ != &r9.tconst._M_string_length) {
    operator_delete((void *)r8._32_8_);
  }
  if ((size_type *)r7._32_8_ != &r8.tconst._M_string_length) {
    operator_delete((void *)r7._32_8_);
  }
  if ((size_type *)r6._32_8_ != &r7.tconst._M_string_length) {
    operator_delete((void *)r6._32_8_);
  }
  if ((size_type *)r5._32_8_ != &r6.tconst._M_string_length) {
    operator_delete((void *)r5._32_8_);
  }
  if ((size_type *)r4._32_8_ != &r5.tconst._M_string_length) {
    operator_delete((void *)r4._32_8_);
  }
  if ((size_type *)r3._32_8_ != &r4.tconst._M_string_length) {
    operator_delete((void *)r3._32_8_);
  }
  if ((size_type *)r2._32_8_ != &r3.tconst._M_string_length) {
    operator_delete((void *)r2._32_8_);
  }
  if ((size_type *)r1._32_8_ != &r2.tconst._M_string_length) {
    operator_delete((void *)r1._32_8_);
  }
  if (local_490 != &r1.tconst._M_string_length) {
    operator_delete(local_490);
  }
  return (int)this_01;
}

Assistant:

BPlusTree init() {
	BPlusTree bplustree(3);
	
	Record r1("r1", 1.00, 1);
	Record r2("r2", 2.00, 2);
	Record r3("r3", 3.00, 3);
	Record r4("r4", 4.00, 4);
	Record r5("r5", 5.00, 5);
	Record r6("r6", 6.00, 6);
	Record r7("r7", 7.00, 7);
	Record r8("r8", 8.00, 8);
	Record r9("r9", 9.00, 9);
	Record r10("r10", 10.00, 10);

	Record r11("r11", 11.00, 11);
	Record r12("r12", 12.00, 12);
	Record r13("r13", 13.00, 13);
	Record r14("r14", 14.00, 14);
	Record r15("r15", 15.00, 15);
	Record r16("r16", 16.00, 16);
	Record r17("r17", 17.00, 17);
	Record r18("r18", 18.00, 18);
	Record r19("r19", 19.00, 19);

	// each block only 2 record
	std::shared_ptr<Block> b1 = std::make_shared<Block>(2);
	// std::cerr << "block address: " << b1 << std::endl;
	std::shared_ptr<Block> b2 = std::make_shared<Block>(2);
	// std::cerr << "block address b2: " << b2 << std::endl;
	std::shared_ptr<Block> b3 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b4 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b5 = std::make_shared<Block>(2);

	std::shared_ptr<Block> b6 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b7 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b8 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b9 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b10 = std::make_shared<Block>(2);

	b1->addRecord(r1);
	b1->addRecord(r2);
    
    b2->addRecord(r3);
	b2->addRecord(r4);

    b3->addRecord(r5);
    b3->addRecord(r6);

	b4->addRecord(r7);
	b4->addRecord(r8);

	b5->addRecord(r9);
	b5->addRecord(r10);

	b6->addRecord(r11);
	b6->addRecord(r12);

	b7->addRecord(r13);
	b7->addRecord(r14);

	b8->addRecord(r15);
	b8->addRecord(r16);

	b9->addRecord(r17);
	b9->addRecord(r18);

	bplustree.InsertKey(1.00, b1);
	bplustree.InsertKey(2.00, b1);

	bplustree.InsertKey(3.00, b2);
    bplustree.InsertKey(4.00, b2);

    bplustree.InsertKey(5.00, b3);
    bplustree.InsertKey(6.00, b3);
 
	bplustree.InsertKey(7.00, b4);
    bplustree.InsertKey(8.00, b4);

	bplustree.InsertKey(9.00, b5);
    bplustree.InsertKey(10.00, b5);

	bplustree.InsertKey(11.00, b6);
	bplustree.InsertKey(12.00, b6);

	bplustree.InsertKey(13.00, b7);
	bplustree.InsertKey(14.00, b7);

	bplustree.InsertKey(15.00, b8);
	bplustree.InsertKey(16.00, b8);

	bplustree.InsertKey(17.00, b9);

	return bplustree;
}